

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter_gui.c
# Opt level: O2

void sendatoms(int argc,t_atom *argv,int raw)

{
  t_symbol *s;
  char *pcVar1;
  t_atom *a;
  bool bVar2;
  t_float tVar3;
  
  if (argc < 1) {
    argc = 0;
  }
switchD_0016d167_caseD_6:
  a = argv;
  bVar2 = argc == 0;
  argc = argc + -1;
  if (bVar2) {
    return;
  }
  argv = a + 1;
  switch(a->a_type) {
  case A_FLOAT:
    tVar3 = atom_getfloat(a);
    sys_vgui("%g ",(double)tVar3);
    goto switchD_0016d167_caseD_6;
  case A_SYMBOL:
  case A_DOLLSYM:
    s = (t_symbol *)((a->a_w).w_symbol)->s_name;
    if (raw == 0) {
      s = (t_symbol *)str_escape((char *)s,0);
      pcVar1 = "{%s} ";
    }
    else {
      pcVar1 = "%s ";
    }
    break;
  case A_POINTER:
    s = (a->a_w).w_symbol;
    pcVar1 = "%p ";
    break;
  case A_SEMI:
    pcVar1 = "\\; ";
    goto LAB_0016d1e8;
  case A_COMMA:
    if (raw == 0) {
      pcVar1 = "{,} ";
    }
    else {
      pcVar1 = ", ";
    }
LAB_0016d1e8:
    sys_vgui(pcVar1);
  default:
    goto switchD_0016d167_caseD_6;
  case A_DOLLAR:
    if (raw == 0) {
      pcVar1 = "{$%d} ";
    }
    else {
      pcVar1 = "$%d ";
    }
    sys_vgui(pcVar1,(ulong)(uint)(a->a_w).w_index);
    goto switchD_0016d167_caseD_6;
  }
  sys_vgui(pcVar1,s);
  goto switchD_0016d167_caseD_6;
}

Assistant:

static void sendatoms(int argc, t_atom*argv, int raw) {
    int i;
    for(i=0; i<argc; i++)
    {
        t_atom *a=argv++;
        switch (a->a_type) {
        default:
            break;
        case A_FLOAT:
                /* HACK: currently ATOMARRAY is only used for setting fonts
                 * and Tcl/Tk is picky when it receives non-integers as fontsize
                 */
            sys_vgui("%g ", atom_getfloat(a));
            break;
        case A_DOLLAR:
            if(raw)
                sys_vgui("$%d ", a->a_w.w_index);
            else
                sys_vgui("{$%d} ", a->a_w.w_index);
            break;
        case A_DOLLSYM:
        case A_SYMBOL:
            if(raw)
                sys_vgui("%s ", a->a_w.w_symbol->s_name);
            else
                sys_vgui("{%s} ", str_escape(a->a_w.w_symbol->s_name, 0));
            break;
        case A_POINTER:
            sys_vgui("%p ", a->a_w.w_gpointer);
            break;
        case A_SEMI:
            sys_vgui("\\; ");
            break;
        case A_COMMA:
            if (raw)
                sys_vgui(", ");
            else
                sys_vgui("{,} ");
            break;
        }
    }
}